

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O1

void __thiscall adios2::core::ADIOS::ProcessUserConfig(ADIOS *this)

{
  bool bVar1;
  char *__s;
  string cfgFile;
  string homePath;
  string local_58;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  __s = getenv("HOME");
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,(ulong)__s);
  SetUserOptionDefaults(this);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  bVar1 = adios2sys::SystemTools::FileExists(&local_58);
  if (bVar1) {
    helper::ParseUserOptionsFile(&this->m_Comm,&local_58,&this->m_UserOptions,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ADIOS::ProcessUserConfig()
{
    // read config parameters from config file
    std::string homePath;
#ifdef _WIN32
    homePath = getenv("HOMEPATH");
#else
    homePath = getenv("HOME");
#endif
    SetUserOptionDefaults();
    const std::string cfgFile = homePath + "/.config/adios2/adios2.yaml";
    if (adios2sys::SystemTools::FileExists(cfgFile))
    {
        helper::ParseUserOptionsFile(m_Comm, cfgFile, m_UserOptions, homePath);
    }
}